

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_minVal(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_rcdesc rc;
  vm_rcdesc local_70;
  
  vm_rcdesc::init(&local_70,(EVP_PKEY_CTX *)"Vector.minVal");
  get_minmax(this,self,retval,argc,&local_70,-1,0);
  return 1;
}

Assistant:

int CVmObjVector::getp_minVal(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "Vector.minVal", self, 33, G_stk->get(0),
                 argc != 0 ? *argc : 0);
    return get_minmax(vmg_ self, retval, argc, &rc, -1, FALSE);
}